

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O0

qint64 __thiscall QHttpNetworkReply::bytesAvailableNextBlock(QHttpNetworkReply *this)

{
  bool bVar1;
  QHttpNetworkConnectionPrivate *in_RDI;
  QHttpNetworkReplyPrivate *d;
  QHttpNetworkReply *in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  d_func((QHttpNetworkReply *)0x3045dc);
  bVar1 = QPointer::operator_cast_to_bool((QPointer<QHttpNetworkConnection> *)0x3045f2);
  if (bVar1) {
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x304609);
    QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x304611);
    local_8 = QHttpNetworkConnectionPrivate::uncompressedBytesAvailableNextBlock
                        (in_RDI,in_stack_ffffffffffffffd8);
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

qint64 QHttpNetworkReply::bytesAvailableNextBlock() const
{
    Q_D(const QHttpNetworkReply);
    if (d->connection)
        return d->connection->d_func()->uncompressedBytesAvailableNextBlock(*this);
    else
        return -1;
}